

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ignorm.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream *this;
  GeneralizedCepstrumInverseGainNormalization *this_00;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  allocator local_415;
  int num_order;
  double gamma;
  GeneralizedCepstrumInverseGainNormalization local_408;
  GeneralizedCepstrumInverseGainNormalization generalized_cepstrum_inverse_gain_normalization;
  vector<double,_std::allocator<double>_> generalized_cepstrum;
  ostringstream error_message_5;
  ifstream ifs;
  byte abStack_218 [488];
  
  gamma = 0.0;
  num_order = 0x19;
  while( true ) {
    while( true ) {
      while (iVar3 = ya_getopt_long(argc,argv,"m:g:c:h",(option *)0x0,(int *)0x0), iVar3 == 99) {
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
        bVar7 = sptk::ConvertStringToInteger
                          ((string *)&ifs,(int *)&generalized_cepstrum_inverse_gain_normalization);
        bVar1 = (int)generalized_cepstrum_inverse_gain_normalization.
                     _vptr_GeneralizedCepstrumInverseGainNormalization < 1;
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar7 || bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,
                          "The argument for the -c option must be a positive integer");
          std::__cxx11::string::string((string *)&error_message_5,"ignorm",(allocator *)&local_408);
          sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
          goto LAB_0010297c;
        }
        gamma = -1.0 / (double)(int)generalized_cepstrum_inverse_gain_normalization.
                                    _vptr_GeneralizedCepstrumInverseGainNormalization;
      }
      if (iVar3 == 0x67) break;
      if (iVar3 != 0x6d) {
        if (iVar3 != -1) {
          if (iVar3 != 0x68) {
            anon_unknown.dwarf_2b03::PrintUsage((ostream *)&std::cerr);
            return 1;
          }
          anon_unknown.dwarf_2b03::PrintUsage((ostream *)&std::cout);
          return 0;
        }
        if (1 < argc - ya_optind) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"Too many input files");
          std::__cxx11::string::string
                    ((string *)&error_message_5,"ignorm",
                     (allocator *)&generalized_cepstrum_inverse_gain_normalization);
          sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
          goto LAB_0010297c;
        }
        if (argc == ya_optind) {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = argv[ya_optind];
        }
        bVar1 = sptk::SetBinaryMode();
        this = (ostringstream *)&ifs;
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream(this);
          std::operator<<((ostream *)this,"Cannot set translation mode");
          std::__cxx11::string::string
                    ((string *)&error_message_5,"ignorm",
                     (allocator *)&generalized_cepstrum_inverse_gain_normalization);
          sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
          goto LAB_0010297c;
        }
        std::ifstream::ifstream(this);
        if ((pcVar5 == (char *)0x0) ||
           (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar5),
           (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
          cVar2 = std::__basic_file<char>::is_open();
          if (cVar2 == '\0') {
            this = (ostringstream *)&std::cin;
          }
          sptk::GeneralizedCepstrumInverseGainNormalization::
          GeneralizedCepstrumInverseGainNormalization
                    (&generalized_cepstrum_inverse_gain_normalization,num_order,gamma);
          if (generalized_cepstrum_inverse_gain_normalization.is_valid_ != false) {
            lVar6 = (long)num_order;
            std::vector<double,_std::allocator<double>_>::vector
                      (&generalized_cepstrum,lVar6 + 1U,(allocator_type *)&error_message_5);
            goto LAB_00102a0c;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
          std::operator<<((ostream *)&error_message_5,
                          "Failed to initialize GeneralizedCepstrumInverseGainNormalization");
          std::__cxx11::string::string
                    ((string *)&local_408,"ignorm",(allocator *)&generalized_cepstrum);
          sptk::PrintErrorMessage((string *)&local_408,&error_message_5);
          this_00 = &local_408;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
          poVar4 = std::operator<<((ostream *)&error_message_5,"Cannot open file ");
          std::operator<<(poVar4,pcVar5);
          std::__cxx11::string::string
                    ((string *)&generalized_cepstrum_inverse_gain_normalization,"ignorm",
                     (allocator *)&local_408);
          sptk::PrintErrorMessage
                    ((string *)&generalized_cepstrum_inverse_gain_normalization,&error_message_5);
          this_00 = &generalized_cepstrum_inverse_gain_normalization;
        }
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
        iVar3 = 1;
        goto LAB_00102b5a;
      }
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
      bVar7 = num_order < 0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::__cxx11::string::string
                  ((string *)&error_message_5,"ignorm",
                   (allocator *)&generalized_cepstrum_inverse_gain_normalization);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_0010297c;
      }
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
    bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&gamma);
    if (!bVar1) break;
    bVar1 = sptk::IsValidGamma(gamma);
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar1) {
LAB_001027f3:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -g option must be in [-1.0, 1.0]");
      std::__cxx11::string::string
                ((string *)&error_message_5,"ignorm",
                 (allocator *)&generalized_cepstrum_inverse_gain_normalization);
      sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
LAB_0010297c:
      std::__cxx11::string::~string((string *)&error_message_5);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
      return 1;
    }
  }
  std::__cxx11::string::~string((string *)&ifs);
  goto LAB_001027f3;
LAB_00102a0c:
  iVar3 = (int)(lVar6 + 1U);
  bVar1 = sptk::ReadStream<double>(false,0,0,iVar3,&generalized_cepstrum,(istream *)this,(int *)0x0)
  ;
  if (!bVar1) {
    iVar3 = 0;
    goto LAB_00102b50;
  }
  bVar1 = sptk::GeneralizedCepstrumInverseGainNormalization::Run
                    (&generalized_cepstrum_inverse_gain_normalization,&generalized_cepstrum);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
    std::operator<<((ostream *)&error_message_5,"Failed to denormalize generalized cepstrum");
    std::__cxx11::string::string((string *)&local_408,"ignorm",&local_415);
    sptk::PrintErrorMessage((string *)&local_408,&error_message_5);
    goto LAB_00102b39;
  }
  bVar1 = sptk::WriteStream<double>(0,iVar3,&generalized_cepstrum,(ostream *)&std::cout,(int *)0x0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
    std::operator<<((ostream *)&error_message_5,"Failed to write generalized cepstrum");
    std::__cxx11::string::string((string *)&local_408,"ignorm",&local_415);
    sptk::PrintErrorMessage((string *)&local_408,&error_message_5);
LAB_00102b39:
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
    iVar3 = 1;
LAB_00102b50:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&generalized_cepstrum.super__Vector_base<double,_std::allocator<double>_>);
LAB_00102b5a:
    std::ifstream::~ifstream(&ifs);
    return iVar3;
  }
  goto LAB_00102a0c;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  double gamma(kDefaultGamma);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:g:c:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("ignorm", error_message);
          return 1;
        }
        break;
      }
      case 'g': {
        if (!sptk::ConvertStringToDouble(optarg, &gamma) ||
            !sptk::IsValidGamma(gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -g option must be in [-1.0, 1.0]";
          sptk::PrintErrorMessage("ignorm", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("ignorm", error_message);
          return 1;
        }
        gamma = -1.0 / tmp;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("ignorm", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("ignorm", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("ignorm", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::GeneralizedCepstrumInverseGainNormalization
      generalized_cepstrum_inverse_gain_normalization(num_order, gamma);
  if (!generalized_cepstrum_inverse_gain_normalization.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize GeneralizedCepstrumInverseGainNormalization";
    sptk::PrintErrorMessage("ignorm", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> generalized_cepstrum(length);

  while (sptk::ReadStream(false, 0, 0, length, &generalized_cepstrum,
                          &input_stream, NULL)) {
    if (!generalized_cepstrum_inverse_gain_normalization.Run(
            &generalized_cepstrum)) {
      std::ostringstream error_message;
      error_message << "Failed to denormalize generalized cepstrum";
      sptk::PrintErrorMessage("ignorm", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, generalized_cepstrum, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write generalized cepstrum";
      sptk::PrintErrorMessage("ignorm", error_message);
      return 1;
    }
  }

  return 0;
}